

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9Texture.cpp
# Opt level: O0

GMM_STATUS __thiscall
GmmLib::GmmGen9TextureCalc::MSAACCSUsage(GmmGen9TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo)

{
  bool local_29;
  GMM_STATUS local_1c;
  GMM_STATUS Status;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmGen9TextureCalc *this_local;
  
  local_1c = GMM_SUCCESS;
  if ((pTexInfo->MSAA).NumSamples < 2) {
    if ((((((ulong)(pTexInfo->Flags).Info >> 0x22 & 1) == 0) &&
         (((ulong)(pTexInfo->Flags).Info >> 0x23 & 1) == 0)) &&
        (((((ulong)(pTexInfo->Flags).Info >> 0x13 & 1) == 0 ||
          ((((((ulong)(pTexInfo->Flags).Info >> 0x24 & 1) != 0 ||
             (((ulong)(pTexInfo->Flags).Info >> 0x2b & 1) != 0)) ||
            (((ulong)(pTexInfo->Flags).Info >> 0x26 & 1) != 0)) ||
           (((ulong)(pTexInfo->Flags).Info >> 0x2c & 1) != 0)))) ||
         ((pTexInfo->Type == RESOURCE_BUFFER && (((ulong)(pTexInfo->Flags).Info >> 0x13 & 1) != 0)))
         ))) && ((pTexInfo->BitsPerPixel == 0x20 ||
                 ((pTexInfo->BitsPerPixel == 0x40 || (pTexInfo->BitsPerPixel == 0x80)))))) {
      local_29 = true;
      if (((SUB84((pTexInfo->Flags).Info,4) >> 4 & 1) == 0) &&
         (local_29 = true, (SUB84((pTexInfo->Flags).Info,4) >> 5 & 1) == 0)) {
        local_29 = ((ulong)(pTexInfo->Flags).Info >> 0x26 & 1) != 0;
      }
      (pTexInfo->Flags).Gpu =
           (anon_struct_8_45_9b07292e_for_Gpu)
           ((ulong)(pTexInfo->Flags).Gpu & 0xfffffdffffffffff | (ulong)local_29 << 0x29);
      (pTexInfo->Flags).Gpu =
           (anon_struct_8_45_9b07292e_for_Gpu)
           ((ulong)(pTexInfo->Flags).Gpu & 0xfffffeffffffffff |
           (ulong)(SUB84((pTexInfo->Flags).Info,4) >> 3 & 1) << 0x28);
    }
    else {
      local_1c = GMM_ERROR;
    }
  }
  else {
    local_1c = GmmTextureCalc::MSAACompression(&this->super_GmmTextureCalc,pTexInfo);
  }
  return local_1c;
}

Assistant:

GMM_STATUS GMM_STDCALL GmmLib::GmmGen9TextureCalc::MSAACCSUsage(GMM_TEXTURE_INFO *pTexInfo)
{
    GMM_STATUS Status = GMM_SUCCESS;

    if(pTexInfo->MSAA.NumSamples > 1) // CCS for MSAA Compression
    {
        Status = MSAACompression(pTexInfo);
    }
    else // Non-MSAA CCS Use (i.e. Render Target Fast Clear)
    {
        if(!pTexInfo->Flags.Info.TiledW &&
           (!pTexInfo->Flags.Info.TiledX) &&
           ((!pTexInfo->Flags.Info.Linear) ||
            (GMM_IS_4KB_TILE(pTexInfo->Flags) || GMM_IS_64KB_TILE(pTexInfo->Flags) ||
             (pTexInfo->Type == RESOURCE_BUFFER && pTexInfo->Flags.Info.Linear))) && //!Yf - deprecate Yf
           ((pTexInfo->BitsPerPixel == 32) ||
            (pTexInfo->BitsPerPixel == 64) ||
            (pTexInfo->BitsPerPixel == 128)))
        {
            // For non-MSAA CCS usage, the four tables of
            // requirements:
            // (1) RT Alignment (GMM Don't Care: Occurs Naturally)
            // (2) ClearRect Alignment
            // (3) ClearRect Scaling (GMM Don't Care: GHAL3D Matter)
            // (4) Non-MSAA CCS Sizing

            // Gen8+:
            // Since mip-mapped and arrayed surfaces are supported, we
            // deal with alignment later at per mip level. Here, we set
            // tiling type only. TileX is not supported on Gen9+.
            // Pre-Gen8:
            // (!) For all the above, there are separate entries for
            // 32/64/128bpp--and then deals with PIXEL widths--Here,
            // though, we will unify by considering 8bpp table entries
            // (unlisted--i.e. do the math)--and deal with BYTE widths.

            // (1) RT Alignment -- The surface width and height don't
            // need to be padded to RT CL granularity. On HSW, all tiled
            // RT's will have appropriate alignment (given 4KB surface
            // base and no mip-map support) and appropriate padding
            // (due to tile padding). On BDW+, GMM uses H/VALIGN that
            // will guarantee the MCS RT alignment for all subresources.

            // (2) ClearRect Alignment -- I.e. FastClears must be done
            // with certain granularity:
            //  TileY:  512 Bytes x 128 Lines
            //  TileX: 1024 Bytes x  64 Lines
            // So a CCS must be sized to match that granularity (though
            // the RT itself need not be fully padded to that
            // granularity to use FastClear).

            // (4) Non-MSAA CCS Sizing -- CCS sizing is based on the
            // size of the FastClear (with granularity padding) for the
            // paired RT. CCS's (byte widths and heights) are scaled
            // down from their RT's by:
            //  TileY: 32 x 32
            //  TileX: 64 x 16

            // ### Example #############################################
            // RT:         800x600, 32bpp, TileY
            // 8bpp:      3200x600
            // FastClear: 3584x640 (for TileY FastClear Granularity of 512x128)
            // CCS:       112x20 (for TileY RT:CCS Sizing Downscale of 32x32)

            pTexInfo->Flags.Gpu.__NonMsaaTileYCcs = pTexInfo->Flags.Info.TiledY || pTexInfo->Flags.Info.TiledYf || pTexInfo->Flags.Info.TiledYs;
            pTexInfo->Flags.Gpu.__NonMsaaTileXCcs = pTexInfo->Flags.Info.TiledX;
        }
        else
        {
            GMM_ASSERTDPF(0, "Illegal CCS creation parameters!");
            Status = GMM_ERROR;
        }
    }
    return Status;
}